

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall SquareSolverService::Run(SquareSolverService *this)

{
  type *in_RDI;
  thread *unaff_retaddr;
  SquareSolverService *in_stack_00000020;
  thread consumer;
  SquareSolverService *in_stack_fffffffffffffff0;
  
  std::thread::thread<SquareSolverService::Run()::_lambda()_1_,,void>(unaff_retaddr,in_RDI);
  ProducerThread(in_stack_00000020);
  StopConsumer(in_stack_fffffffffffffff0);
  std::thread::join();
  std::thread::~thread((thread *)0x106835);
  return;
}

Assistant:

void Run() {
        std::thread consumer([&](){ this->ConsumerThread(); });
        ProducerThread();
        StopConsumer();
        consumer.join();
    }